

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstatemanager_args.cpp
# Opt level: O0

Result<void> * node::ApplyArgsManOptions(ArgsManager *args,Options *opts)

{
  string_view str;
  string_view str_00;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  uint uVar2;
  int iVar3;
  bool *pbVar4;
  bilingual_str *fmt;
  _Storage<long,_true> flag;
  ArgsManager *this;
  int *piVar5;
  long *plVar6;
  long lVar7;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Result<void> *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar8;
  size_t clamped_size_each;
  int script_threads;
  optional<bool> value_1;
  optional<long> max_size;
  optional<long> value_4;
  optional<long> value;
  optional<uint256> block_hash;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value_3
  ;
  optional<uint256> min_work;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value_2
  ;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffa8c;
  ArgsManager *in_stack_fffffffffffffa90;
  char *this_00;
  Result<void> *in_stack_fffffffffffffa98;
  uint256 *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  string *in_stack_fffffffffffffab0;
  ArgsManager *in_stack_fffffffffffffab8;
  ArgsManager *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  ArgsManager *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  ArgsManager *in_stack_fffffffffffffae0;
  uint *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  int source_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  bilingual_str *in_stack_fffffffffffffb08;
  ConstevalFormatString<1U> in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb44;
  char *in_stack_fffffffffffffb48;
  allocator<char> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long local_480;
  Level in_stack_fffffffffffffc30;
  allocator<char> local_3c1;
  int *in_stack_fffffffffffffc40;
  allocator<char> local_391;
  undefined8 local_390;
  allocator<char> local_385;
  int local_384;
  allocator<char> local_37e;
  allocator<char> local_37d;
  int local_37c;
  allocator<char> local_376;
  allocator<char> local_375;
  allocator<char> local_374;
  _Optional_payload_base<bool> local_373;
  allocator<char> local_371;
  long local_370;
  allocator<char> local_361;
  _Storage<long,_true> local_360;
  undefined1 local_358;
  _Storage<long,_true> local_350;
  undefined1 local_348;
  _Storage<long,_true> local_340;
  undefined1 local_338;
  char local_160 [344];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  oVar8 = ArgsManager::GetIntArg
                    (in_stack_fffffffffffffad0,
                     (string *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_340._M_value =
       oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_338 = oVar8.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::allocator<char>::~allocator(&local_361);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<long> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                    );
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    ArgsManager::GetArg(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar1) {
      local_480 = 1;
    }
    else {
      plVar6 = std::optional<long>::operator*
                         ((optional<long> *)
                          CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      local_480 = *plVar6;
    }
    local_370 = local_480;
    std::optional<int>::operator=
              ((optional<int> *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<char>::~allocator(&local_371);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_373 = (_Optional_payload_base<bool>)
              ArgsManager::GetBoolArg(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::allocator<char>::~allocator(&local_374);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<bool> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                    );
  if (bVar1) {
    pbVar4 = std::optional<bool>::operator*
                       ((optional<bool> *)
                        CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    *(byte *)(in_RDX + 0x38) = *pbVar4 & 1;
  }
  pbVar11 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  ArgsManager::GetArg(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::allocator<char>::~allocator(&local_375);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    str._M_str._0_7_ = in_stack_fffffffffffffaa8;
    str._M_len = (size_t)in_stack_fffffffffffffaa0;
    str._M_str._7_1_ = in_stack_fffffffffffffaaf;
    uint256::FromUserHex(str);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<uint256> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar1) {
      std::optional<uint256>::operator*
                ((optional<uint256> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
      ;
      UintToArith256(in_stack_fffffffffffffaa0);
      std::optional<arith_uint256>::operator=
                ((optional<arith_uint256> *)in_stack_fffffffffffffa98,
                 (arith_uint256 *)in_stack_fffffffffffffa90);
      goto LAB_0112cf01;
    }
    in_stack_fffffffffffffb48 = local_160;
    in_stack_fffffffffffffb50 = &local_376;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Untranslated((string *)in_stack_fffffffffffffac0);
    in_stack_fffffffffffffb38.fmt =
         (char *)std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    in_stack_fffffffffffffb44 = base_blob<256U>::size();
    local_37c = in_stack_fffffffffffffb44 * 2;
    tinyformat::format<std::__cxx11::string,unsigned_int>
              (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    util::Result<void>::Result(in_stack_fffffffffffffa98,(Error *)in_stack_fffffffffffffa90);
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<char>::~allocator(&local_376);
    bVar1 = true;
  }
  else {
LAB_0112cf01:
    bVar1 = false;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (bVar1) goto LAB_0112d75c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  ArgsManager::GetArg(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::allocator<char>::~allocator(&local_37d);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    str_00._M_str._0_7_ = in_stack_fffffffffffffaa8;
    str_00._M_len = (size_t)in_stack_fffffffffffffaa0;
    str_00._M_str._7_1_ = in_stack_fffffffffffffaaf;
    uint256::FromUserHex(str_00);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<uint256> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar1) {
      std::optional<uint256>::operator*
                ((optional<uint256> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
      ;
      std::optional<uint256>::operator=
                ((optional<uint256> *)in_stack_fffffffffffffa98,(uint256 *)in_stack_fffffffffffffa90
                );
      goto LAB_0112d26d;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Untranslated((string *)in_stack_fffffffffffffac0);
    fmt = (bilingual_str *)
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    uVar2 = base_blob<256U>::size();
    local_384 = uVar2 * 2;
    tinyformat::format<std::__cxx11::string,unsigned_int>
              (fmt,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    util::Result<void>::Result(in_stack_fffffffffffffa98,(Error *)in_stack_fffffffffffffa90);
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<char>::~allocator(&local_37e);
    bVar1 = true;
  }
  else {
LAB_0112d26d:
    bVar1 = false;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (!bVar1) {
    pbVar10 = in_RSI;
    std::allocator<char>::allocator();
    source_line = (int)((ulong)pbVar10 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    oVar8 = ArgsManager::GetIntArg
                      (in_stack_fffffffffffffad0,
                       (string *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    flag._M_value =
         oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_348 = oVar8.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    local_350._M_value = flag._M_value;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<char>::~allocator(&local_385);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<long> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar1) {
      std::optional<long>::operator*
                ((optional<long> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(long *)0x112d353);
      *(undefined8 *)(in_RDX + 0x88) = local_390;
    }
    ReadDatabaseArgs(in_stack_fffffffffffffac0,(DBOptions *)in_stack_fffffffffffffab8);
    ReadDatabaseArgs(in_stack_fffffffffffffac0,(DBOptions *)in_stack_fffffffffffffab8);
    ReadCoinsViewArgs(in_stack_fffffffffffffae0,(CoinsViewOptions *)in_stack_fffffffffffffad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)in_stack_fffffffffffffad0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    this = (ArgsManager *)
           ArgsManager::GetIntArg
                     (in_stack_fffffffffffffa90,
                      (string *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                      (int64_t)in_stack_fffffffffffffa98);
    iVar3 = (int)this;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<char>::~allocator(&local_391);
    if (iVar3 < 1) {
      GetNumCores();
    }
    piVar5 = std::clamp<int>((int *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                             (int *)in_stack_fffffffffffffaa0,(int *)in_stack_fffffffffffffa98);
    *(int *)(in_RDX + 0xb8) = *piVar5;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0);
    this_00 = "Script verification uses %d additional threads\n";
    uVar9 = 2;
    logging_function._M_str = (char *)pbVar11;
    logging_function._M_len = (size_t)in_stack_fffffffffffffb50;
    source_file._M_len._4_4_ = in_stack_fffffffffffffb44;
    source_file._M_len._0_4_ = in_stack_fffffffffffffb40;
    source_file._M_str = in_stack_fffffffffffffb48;
    LogPrintFormatInternal<int>
              (logging_function,source_file,source_line,flag._M_value,in_stack_fffffffffffffc30,
               in_stack_fffffffffffffb38,in_stack_fffffffffffffc40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)this,(allocator<char> *)CONCAT44(iVar3,in_stack_fffffffffffffac8));
    oVar8 = ArgsManager::GetIntArg(this,(string *)CONCAT44(iVar3,in_stack_fffffffffffffac8));
    local_360._M_value =
         oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_358 = oVar8.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar9));
    std::allocator<char>::~allocator(&local_3c1);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<long> *)CONCAT44(in_stack_fffffffffffffa8c,uVar9));
    if (bVar1) {
      std::optional<long>::operator*((optional<long> *)CONCAT44(in_stack_fffffffffffffa8c,uVar9));
      plVar6 = std::max<long>((long *)this_00,(long *)CONCAT44(in_stack_fffffffffffffa8c,uVar9));
      lVar7 = (*plVar6 << 0x14) / 2;
      *(long *)(in_RDX + 0xc0) = lVar7;
      *(long *)(in_RDX + 200) = lVar7;
    }
    util::Result<void>::Result((Result<void> *)this_00);
  }
LAB_0112d75c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, ChainstateManager::Options& opts)
{
    if (auto value{args.GetIntArg("-checkblockindex")}) {
        // Interpret bare -checkblockindex argument as 1 instead of 0.
        opts.check_block_index = args.GetArg("-checkblockindex")->empty() ? 1 : *value;
    }

    if (auto value{args.GetBoolArg("-checkpoints")}) opts.checkpoints_enabled = *value;

    if (auto value{args.GetArg("-minimumchainwork")}) {
        if (auto min_work{uint256::FromUserHex(*value)}) {
            opts.minimum_chain_work = UintToArith256(*min_work);
        } else {
            return util::Error{strprintf(Untranslated("Invalid minimum work specified (%s), must be up to %d hex digits"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetArg("-assumevalid")}) {
        if (auto block_hash{uint256::FromUserHex(*value)}) {
            opts.assumed_valid_block = *block_hash;
        } else {
            return util::Error{strprintf(Untranslated("Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetIntArg("-maxtipage")}) opts.max_tip_age = std::chrono::seconds{*value};

    ReadDatabaseArgs(args, opts.block_tree_db);
    ReadDatabaseArgs(args, opts.coins_db);
    ReadCoinsViewArgs(args, opts.coins_view);

    int script_threads = args.GetIntArg("-par", DEFAULT_SCRIPTCHECK_THREADS);
    if (script_threads <= 0) {
        // -par=0 means autodetect (number of cores - 1 script threads)
        // -par=-n means "leave n cores free" (number of cores - n - 1 script threads)
        script_threads += GetNumCores();
    }
    // Subtract 1 because the main thread counts towards the par threads.
    opts.worker_threads_num = std::clamp(script_threads - 1, 0, MAX_SCRIPTCHECK_THREADS);
    LogPrintf("Script verification uses %d additional threads\n", opts.worker_threads_num);

    if (auto max_size = args.GetIntArg("-maxsigcachesize")) {
        // 1. When supplied with a max_size of 0, both the signature cache and
        //    script execution cache create the minimum possible cache (2
        //    elements). Therefore, we can use 0 as a floor here.
        // 2. Multiply first, divide after to avoid integer truncation.
        size_t clamped_size_each = std::max<int64_t>(*max_size, 0) * (1 << 20) / 2;
        opts.script_execution_cache_bytes = clamped_size_each;
        opts.signature_cache_bytes = clamped_size_each;
    }

    return {};
}